

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_function_helper.cpp
# Opt level: O1

Image * Image_Function_Helper::Resize
                  (Image *__return_storage_ptr__,ResizeForm4 resize,Image *in,uint32_t widthOut,
                  uint32_t heightOut)

{
  Image_Function::ParameterValidation<PenguinV_Image::ImageTemplate<unsigned_char>>(in);
  PenguinV_Image::ImageTemplate<unsigned_char>::generate
            (__return_storage_ptr__,in,widthOut,heightOut,'\x01','\x01');
  (*resize)(in,0,0,in->_width,in->_height,__return_storage_ptr__,0,0,widthOut,heightOut);
  return __return_storage_ptr__;
}

Assistant:

Image Resize( FunctionTable::ResizeForm4 resize,
                  const Image & in, uint32_t widthOut, uint32_t heightOut )
    {
        Image_Function::ParameterValidation( in );

        Image out = in.generate( widthOut, heightOut );

        resize( in, 0, 0, in.width(), in.height(), out, 0, 0, widthOut, heightOut );

        return out;
    }